

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorHori.cpp
# Opt level: O0

void __thiscall VECTOR_HORI_VERT::VectorHori::Output(VectorHori *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  uint uVar3;
  invalid_argument *this_00;
  ostream *poVar4;
  uint local_2a8;
  uint i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_230;
  ostream local_210 [8];
  ofstream fil;
  VectorHori *this_local;
  
  std::ofstream::ofstream(local_210);
  Vector::get_filename_abi_cxx11_(&local_230,&this->super_Vector);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)local_210,_Var2);
  std::__cxx11::string::~string((string *)&local_230);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    Vector::get_filename_abi_cxx11_((string *)&i,&this->super_Vector);
    std::operator+(&local_280,"Error! Cannot open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::operator+(&local_260,&local_280,"!\n");
    std::invalid_argument::invalid_argument(this_00,(string *)&local_260);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  poVar4 = (ostream *)std::ostream::operator<<(local_210,(this->super_Vector).znak);
  std::operator<<(poVar4,"*");
  local_2a8 = 0;
  while( true ) {
    uVar3 = Vector::get_length(&this->super_Vector);
    if (uVar3 <= local_2a8) break;
    poVar4 = (ostream *)std::ostream::operator<<(local_210,(this->super_Vector).vector_[local_2a8]);
    std::operator<<(poVar4,' ');
    local_2a8 = local_2a8 + 1;
  }
  std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void VectorHori::Output() const {
    std::ofstream fil;
    fil.open(this->get_filename().c_str(), std::ios_base::app);
    if (!fil.is_open()) {
      throw std::invalid_argument("Error! Cannot open file " + this->get_filename() + "!\n");
    }
    fil << this-> znak << "*";
    for (unsigned int i = 0; i < this->get_length(); i++) {
      fil << this->vector_[i] << ' ';
    }
    fil << std::endl;

    fil.close();
  }